

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

String * __thiscall
asl::Console::rgb(String *__return_storage_ptr__,Console *this,int r,int g,int b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int o;
  int b_local;
  int g_local;
  int r_local;
  Console *this_local;
  
  if (this->_colorMode == 2) {
    uVar1 = clamp<int,int>(r,0,0xff);
    uVar2 = clamp<int,int>(g,0,0xff);
    uVar3 = clamp<int,int>(b,0,0xff);
    asl::String::String(__return_storage_ptr__,0xf,"2;%i;%i;%im",(ulong)uVar1,(ulong)uVar2,
                        (ulong)uVar3);
  }
  else {
    iVar4 = clamp<int,int>(r + 0x14,0,0xff);
    iVar5 = clamp<int,int>(g + 0x14,0,0xff);
    iVar6 = clamp<int,int>(b + 0x14,0,0xff);
    asl::String::String(__return_storage_ptr__,0xf,"5;%im",
                        (ulong)(uint)(((iVar4 * 5) / 0xff) * 0x24 + 0x10 + ((iVar5 * 5) / 0xff) * 6
                                     + (iVar6 * 5) / 0xff));
  }
  return __return_storage_ptr__;
}

Assistant:

String Console::rgb(int r, int g, int b) const
{
	const int o = 20;
	if (_colorMode == 2)
		return String(15, "2;%i;%i;%im", clamp(r, 0, 255), clamp(g, 0, 255), clamp(b, 0, 255));
	else
	{
		return String(15, "5;%im", 16 + 36 * (clamp(r + o, 0, 255) * 5 / 255) + 6 * (clamp(g + o, 0, 255) * 5 / 255) + (clamp(b + o, 0, 255) * 5 / 255));
		// if (approx r==g==b) -> use 232 + r/11
	}
}